

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

void __thiscall
Assimp::ObjFileParser::parseFile(ObjFileParser *this,IOStreamBuffer<char> *streamBuffer)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  Model *pMVar4;
  size_t sVar5;
  bool bVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var10;
  aiPrimitiveType type;
  ulong uVar11;
  string name;
  vector<char,_std::allocator<char>_> buffer;
  string local_50 [32];
  
  sVar5 = streamBuffer->m_filesize;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar11 = 0;
  do {
    bVar6 = IOStreamBuffer<char>::getNextDataLine(streamBuffer,&buffer,'\\');
    if (!bVar6) {
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buffer.super__Vector_base<char,_std::allocator<char>_>);
      return;
    }
    (this->m_DataIt)._M_current =
         buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (this->m_DataItEnd)._M_current =
         buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    uVar3 = streamBuffer->m_filePos;
    _Var10._M_current =
         buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
    if (uVar11 < uVar3) {
      (*this->m_progress->_vptr_ProgressHandler[3])
                (this->m_progress,uVar3 & 0xffffffff,(ulong)(uint)sVar5);
      _Var10._M_current = (this->m_DataIt)._M_current;
      uVar11 = uVar3;
    }
    cVar1 = *_Var10._M_current;
    type = aiPrimitiveType_POLYGON;
    switch(cVar1) {
    case 'g':
      getGroupName(this);
      break;
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'n':
    case 'q':
    case 'r':
    case 't':
switchD_00452f36_caseD_68:
      _Var10 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                         (_Var10,(this->m_DataItEnd)._M_current,&this->m_uiLine);
      (this->m_DataIt)._M_current = _Var10._M_current;
      break;
    case 'l':
    case 'p':
      type = (cVar1 == 'l') + aiPrimitiveType_POINT;
    case 'f':
      getFace(this,type);
      break;
    case 'm':
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      getNameNoSpace<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                (_Var10,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                        (this->m_DataItEnd)._M_current,&name);
      lVar9 = std::__cxx11::string::find((char *)&name,0x5de720);
      if (lVar9 != -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&name);
        std::__cxx11::string::operator=((string *)&name,local_50);
        std::__cxx11::string::~string(local_50);
      }
      bVar6 = std::operator==(&name,"mg");
      if (bVar6) {
        getGroupNumberAndResolution(this);
      }
      else {
        bVar6 = std::operator==(&name,"mtllib");
        if (!bVar6) {
          std::__cxx11::string::~string((string *)&name);
          _Var10._M_current = (this->m_DataIt)._M_current;
          goto switchD_00452f36_caseD_68;
        }
        getMaterialLib(this);
      }
      goto LAB_00453115;
    case 'o':
      getObjectName(this);
      break;
    case 's':
      getGroupNumber(this);
      break;
    case 'u':
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      getNameNoSpace<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                (_Var10,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                        (this->m_DataItEnd)._M_current,&name);
      lVar9 = std::__cxx11::string::find((char *)&name,0x5de720);
      if (lVar9 != -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&name);
        std::__cxx11::string::operator=((string *)&name,local_50);
        std::__cxx11::string::~string(local_50);
      }
      bVar6 = std::operator==(&name,"usemtl");
      if (bVar6) {
        getMaterialDesc(this);
      }
LAB_00453115:
      std::__cxx11::string::~string((string *)&name);
      break;
    case 'v':
      (this->m_DataIt)._M_current = _Var10._M_current + 1;
      cVar1 = _Var10._M_current[1];
      if (cVar1 != '\t') {
        if (cVar1 == 't') {
          (this->m_DataIt)._M_current = _Var10._M_current + 2;
          sVar8 = getTexCoordVector(this,&((this->m_pModel)._M_t.
                                           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                                           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>.
                                          _M_head_impl)->m_TextureCoord);
          pMVar4 = (this->m_pModel)._M_t.
                   super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                   .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
          uVar2 = pMVar4->m_TextureCoordDim;
          uVar7 = (uint)sVar8;
          if ((uint)sVar8 < uVar2) {
            uVar7 = uVar2;
          }
          pMVar4->m_TextureCoordDim = uVar7;
          break;
        }
        if (cVar1 == 'n') {
          (this->m_DataIt)._M_current = _Var10._M_current + 2;
          getVector3(this,&((this->m_pModel)._M_t.
                            super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                            .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                           m_Normals);
          break;
        }
        if (cVar1 != ' ') break;
      }
      sVar8 = getNumComponentsInDataDefinition(this);
      if (sVar8 == 6) {
        pMVar4 = (this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
        getTwoVectors3(this,&pMVar4->m_Vertices,&pMVar4->m_VertexColors);
      }
      else if (sVar8 == 4) {
        getHomogeneousVector3
                  (this,&((this->m_pModel)._M_t.
                          super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                          .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                         m_Vertices);
      }
      else if (sVar8 == 3) {
        getVector3(this,&((this->m_pModel)._M_t.
                          super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                          .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                         m_Vertices);
      }
      break;
    default:
      if (cVar1 != '#') goto switchD_00452f36_caseD_68;
      getComment(this);
    }
  } while( true );
}

Assistant:

void ObjFileParser::parseFile( IOStreamBuffer<char> &streamBuffer ) {
    // only update every 100KB or it'll be too slow
    //const unsigned int updateProgressEveryBytes = 100 * 1024;
    unsigned int progressCounter = 0;
    const unsigned int bytesToProcess = static_cast<unsigned int>(streamBuffer.size());
    const unsigned int progressTotal = bytesToProcess;
    unsigned int processed = 0;
    size_t lastFilePos( 0 );

    std::vector<char> buffer;
    while ( streamBuffer.getNextDataLine( buffer, '\\' ) ) {
        m_DataIt = buffer.begin();
        m_DataItEnd = buffer.end();

        // Handle progress reporting
        const size_t filePos( streamBuffer.getFilePos() );
        if ( lastFilePos < filePos ) {
            processed = static_cast<unsigned int>(filePos);
            lastFilePos = filePos;
            progressCounter++;
            m_progress->UpdateFileRead( processed, progressTotal );
        }

        // parse line
        switch (*m_DataIt) {
        case 'v': // Parse a vertex texture coordinate
            {
                ++m_DataIt;
                if (*m_DataIt == ' ' || *m_DataIt == '\t') {
                    size_t numComponents = getNumComponentsInDataDefinition();
                    if (numComponents == 3) {
                        // read in vertex definition
                        getVector3(m_pModel->m_Vertices);
                    } else if (numComponents == 4) {
                        // read in vertex definition (homogeneous coords)
                        getHomogeneousVector3(m_pModel->m_Vertices);
                    } else if (numComponents == 6) {
                        // read vertex and vertex-color
                        getTwoVectors3(m_pModel->m_Vertices, m_pModel->m_VertexColors);
                    }
                } else if (*m_DataIt == 't') {
                    // read in texture coordinate ( 2D or 3D )
                    ++m_DataIt;
                    size_t dim = getTexCoordVector(m_pModel->m_TextureCoord);
                    m_pModel->m_TextureCoordDim = std::max(m_pModel->m_TextureCoordDim, (unsigned int)dim);
                } else if (*m_DataIt == 'n') {
                    // Read in normal vector definition
                    ++m_DataIt;
                    getVector3( m_pModel->m_Normals );
                }
            }
            break;

        case 'p': // Parse a face, line or point statement
        case 'l':
        case 'f':
            {
                getFace(*m_DataIt == 'f' ? aiPrimitiveType_POLYGON : (*m_DataIt == 'l'
                    ? aiPrimitiveType_LINE : aiPrimitiveType_POINT));
            }
            break;

        case '#': // Parse a comment
            {
                getComment();
            }
            break;

        case 'u': // Parse a material desc. setter
            {
                std::string name;

                getNameNoSpace(m_DataIt, m_DataItEnd, name);

                size_t nextSpace = name.find(" ");
                if (nextSpace != std::string::npos)
                    name = name.substr(0, nextSpace);

                if(name == "usemtl")
                {
                    getMaterialDesc();
                }
            }
            break;

        case 'm': // Parse a material library or merging group ('mg')
            {
                std::string name;

                getNameNoSpace(m_DataIt, m_DataItEnd, name);

                size_t nextSpace = name.find(" ");
                if (nextSpace != std::string::npos)
                    name = name.substr(0, nextSpace);

                if (name == "mg")
                    getGroupNumberAndResolution();
                else if(name == "mtllib")
                    getMaterialLib();
				else
					goto pf_skip_line;
            }
            break;

        case 'g': // Parse group name
            {
                getGroupName();
            }
            break;

        case 's': // Parse group number
            {
                getGroupNumber();
            }
            break;

        case 'o': // Parse object name
            {
                getObjectName();
            }
            break;

        default:
            {
pf_skip_line:
                m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
            }
            break;
        }
    }
}